

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O1

qsizetype bm_find(QStringView haystack,qsizetype index,QStringView needle,uchar *skiptable,
                 CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  storage_type_conflict *psVar11;
  ulong uVar12;
  storage_type_conflict *psVar13;
  long lVar14;
  byte *pbVar15;
  short sVar16;
  storage_type_conflict *psVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  char cVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  storage_type_conflict *psVar25;
  long in_FS_OFFSET;
  bool bVar26;
  QStringView s;
  char16_t foldBuffer [256];
  storage_type_conflict *local_290;
  QStringView local_248;
  ushort local_238 [256];
  long local_38;
  
  pbVar15 = (byte *)haystack.m_size;
  psVar17 = haystack.m_data;
  uVar19 = needle.m_size;
  psVar11 = needle.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar19 == 0) {
    local_290 = (storage_type_conflict *)0xffffffffffffffff;
    if (index <= (long)pbVar15) {
      local_290 = (storage_type_conflict *)index;
    }
  }
  else {
    psVar1 = psVar17 + (long)pbVar15;
    if (cs == CaseSensitive) {
      psVar13 = psVar17 + index + (uVar19 - 1);
      local_290 = psVar1;
      do {
        bVar26 = psVar1 <= psVar13;
        if (bVar26) goto joined_r0x0011e95f;
        uVar24 = (ulong)skiptable[(byte)*psVar13];
        if (uVar24 == 0) {
          if (0 < (long)uVar19) {
            if (*psVar13 == psVar11[uVar19 - 1]) {
              lVar14 = 0;
              do {
                if (1 - uVar19 == lVar14) goto LAB_0011e3b4;
                lVar4 = lVar14 + -1;
                lVar23 = lVar14 + -1;
                lVar5 = lVar14 + -2;
                lVar14 = lVar23;
              } while (psVar13[lVar4] == psVar11[uVar19 + lVar5]);
              lVar23 = -lVar23;
              bVar10 = lVar23 < (long)uVar19;
            }
            else {
              lVar23 = 0;
              bVar10 = 0 < (long)uVar19;
            }
            if (bVar10) {
              uVar24 = uVar19 - lVar23;
              if (skiptable[(byte)psVar13[-lVar23]] != uVar19) {
                uVar24 = 1;
              }
              goto LAB_0011e324;
            }
          }
LAB_0011e3b4:
          local_290 = (storage_type_conflict *)(((long)psVar13 - (long)psVar17 >> 1) - (uVar19 - 1))
          ;
          cVar21 = '\x01';
        }
        else {
LAB_0011e324:
          uVar8 = 0;
          if (psVar13 <= psVar1 + -uVar24) {
            uVar8 = uVar24;
          }
          bVar10 = psVar1 + -uVar24 < psVar13;
          psVar13 = psVar13 + uVar8;
          cVar21 = bVar10 * '\x03';
        }
      } while (cVar21 == '\0');
      if (cVar21 == '\x03') {
        bVar26 = true;
      }
    }
    else {
      memset(local_238,0xaa,0x200);
      uVar24 = 0x100;
      if ((long)uVar19 < 0x100) {
        uVar24 = uVar19;
      }
      if (0 < (long)uVar19) {
        uVar8 = 0;
        do {
          sVar2 = psVar11[uVar8];
          uVar18 = (uint)(ushort)sVar2;
          if (((uVar8 != 0) && (((ushort)sVar2 & 0xfc00) == 0xdc00)) &&
             ((psVar11[uVar8 - 1] & 0xfc00U) == 0xd800)) {
            uVar18 = (uint)(ushort)sVar2 + (uint)(ushort)psVar11[uVar8 - 1] * 0x400 + 0xfca02400;
          }
          uVar22 = 0xff;
          if (uVar18 < 0x11000) {
            uVar22 = 0x1f;
          }
          uVar3 = uVar18 >> 5;
          if (0x10fff < uVar18) {
            uVar3 = (uVar18 - 0x11000 >> 8) + 0x880;
          }
          uVar20 = (uint)(int)(short)*(ushort *)
                                      (QUnicodeTables::uc_properties +
                                      (ulong)*(ushort *)
                                              (QUnicodeTables::uc_property_trie +
                                              (ulong)((uVar22 & uVar18) +
                                                     (uint)*(ushort *)
                                                            (QUnicodeTables::uc_property_trie +
                                                            (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >>
                   1;
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar22 & uVar18) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2) *
                0x14 + 0xe) & 1) == 0) {
            uVar18 = uVar18 + (uVar20 & 0xffff);
          }
          else {
            lVar23 = (long)(short)uVar20;
            if (*(short *)(QUnicodeTables::specialCaseMap + lVar23 * 2) == 1) {
              uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar23 * 2 + 2);
            }
          }
          local_238[uVar8] = (ushort)uVar18;
          uVar8 = uVar8 + 1;
        } while (uVar24 != uVar8);
      }
      psVar13 = psVar17 + index + (uVar24 - 1);
      do {
        bVar26 = psVar1 <= psVar13;
        if (bVar26) goto joined_r0x0011e95f;
        sVar2 = *psVar13;
        uVar18 = (uint)(ushort)sVar2;
        if (((psVar17 <= psVar13 && (long)psVar13 - (long)psVar17 != 0) &&
             ((ushort)sVar2 & 0xfc00) == 0xdc00) && ((psVar13[-1] & 0xfc00U) == 0xd800)) {
          uVar18 = (uint)(ushort)sVar2 + (uint)(ushort)psVar13[-1] * 0x400 + 0xfca02400;
        }
        uVar22 = 0xff;
        if (uVar18 < 0x11000) {
          uVar22 = 0x1f;
        }
        uVar3 = uVar18 >> 5;
        if (0x10fff < uVar18) {
          uVar3 = (uVar18 - 0x11000 >> 8) + 0x880;
        }
        uVar20 = (uint)(int)(short)*(ushort *)
                                    (QUnicodeTables::uc_properties +
                                    (ulong)*(ushort *)
                                            (QUnicodeTables::uc_property_trie +
                                            (ulong)((uVar22 & uVar18) +
                                                   (uint)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >> 1
        ;
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)((uVar22 & uVar18) +
                             (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2))
                      * 2) * 0x14 + 0xe) & 1) == 0) {
          uVar18 = uVar18 + (uVar20 & 0xffff);
        }
        else {
          lVar23 = (long)(short)uVar20;
          if (*(short *)(QUnicodeTables::specialCaseMap + lVar23 * 2) == 1) {
            uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar23 * 2 + 2);
          }
        }
        uVar8 = (ulong)skiptable[uVar18 & 0xff];
        if (uVar8 == 0) {
          if ((long)uVar19 < 1) {
            uVar8 = 0;
          }
          else {
            lVar23 = 1;
            lVar14 = 0;
            psVar25 = psVar13;
            bVar10 = 0 < (long)uVar19;
            do {
              sVar2 = psVar13[lVar14];
              uVar18 = (uint)(ushort)sVar2;
              if (((psVar17 < psVar25) && (((ushort)sVar2 & 0xfc00) == 0xdc00)) &&
                 ((psVar13[lVar14 + -1] & 0xfc00U) == 0xd800)) {
                uVar18 = (uint)(ushort)sVar2 + (uint)(ushort)psVar13[lVar14 + -1] * 0x400 +
                         0xfca02400;
              }
              uVar22 = 0xff;
              if (uVar18 < 0x11000) {
                uVar22 = 0x1f;
              }
              uVar3 = uVar18 >> 5;
              if (0x10fff < uVar18) {
                uVar3 = (uVar18 - 0x11000 >> 8) + 0x880;
              }
              sVar16 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar22 & uVar18) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar3 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar22 & uVar18) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2
                            ) * 0x14 + 0xe) & 1) == 0) {
                uVar18 = uVar18 + (int)sVar16;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar16 * 2) == 1) {
                uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar16 * 2 + 2);
              }
              if (uVar18 != local_238[uVar24 + lVar14 + -1]) {
                uVar8 = -lVar14;
                if (bVar10) goto LAB_0011e7e8;
                break;
              }
              bVar10 = lVar23 < (long)uVar24;
              lVar14 = lVar14 + -1;
              lVar23 = lVar23 + 1;
              psVar25 = psVar25 + -1;
              uVar8 = uVar24;
            } while (-uVar24 != lVar14);
          }
          psVar25 = (storage_type_conflict *)(((long)psVar13 - (long)psVar17 >> 1) - (uVar24 - 1));
          pbVar9 = (byte *)((long)psVar25 + uVar24);
          if ((long)pbVar15 <= (long)((long)psVar25 + uVar24)) {
            pbVar9 = pbVar15;
          }
          local_248.m_size = (long)pbVar15 - (long)pbVar9;
          local_248.m_data = psVar17 + (long)pbVar9;
          if ((long)uVar19 < 0x101) {
            bVar10 = false;
          }
          else {
            s.m_size = uVar19 - uVar24;
            s.m_data = psVar11 + uVar24;
            bVar6 = QStringView::startsWith(&local_248,s,CaseInsensitive);
            bVar10 = !bVar6;
            if (!bVar6) {
              psVar25 = local_290;
            }
          }
          local_290 = psVar25;
          iVar7 = 1;
          if (bVar10) {
LAB_0011e7e8:
            psVar25 = psVar13 + -uVar8;
            sVar2 = *psVar25;
            uVar18 = (uint)(ushort)sVar2;
            if ((psVar17 < psVar25 && ((ushort)sVar2 & 0xfc00) == 0xdc00) &&
               ((psVar25[-1] & 0xfc00U) == 0xd800)) {
              uVar18 = (uint)(ushort)sVar2 + (uint)(ushort)psVar25[-1] * 0x400 + 0xfca02400;
            }
            uVar22 = 0xff;
            if (uVar18 < 0x11000) {
              uVar22 = 0x1f;
            }
            uVar3 = uVar18 >> 5;
            if (0x10fff < uVar18) {
              uVar3 = (uVar18 - 0x11000 >> 8) + 0x880;
            }
            uVar20 = (uint)(int)(short)*(ushort *)
                                        (QUnicodeTables::uc_properties +
                                        (ulong)*(ushort *)
                                                (QUnicodeTables::uc_property_trie +
                                                (ulong)((uVar22 & uVar18) +
                                                       (uint)*(ushort *)
                                                              (QUnicodeTables::uc_property_trie +
                                                              (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe)
                     >> 1;
            if ((*(ushort *)
                  (QUnicodeTables::uc_properties +
                  (ulong)*(ushort *)
                          (QUnicodeTables::uc_property_trie +
                          (ulong)((uVar22 & uVar18) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2)
                  * 0x14 + 0xe) & 1) == 0) {
              uVar18 = uVar18 + (uVar20 & 0xffff);
            }
            else {
              lVar23 = (long)(short)uVar20;
              if (*(short *)(QUnicodeTables::specialCaseMap + lVar23 * 2) == 1) {
                uVar18 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar23 * 2 + 2);
              }
            }
            uVar8 = uVar24 - uVar8;
            if (skiptable[uVar18 & 0xff] != uVar19) {
              uVar8 = 1;
            }
            goto LAB_0011e8c0;
          }
        }
        else {
LAB_0011e8c0:
          uVar12 = 0;
          if (psVar13 <= psVar1 + -uVar8) {
            uVar12 = uVar8;
          }
          psVar25 = psVar13 + uVar12;
          iVar7 = 0;
          bVar10 = psVar1 + -uVar8 < psVar13;
          psVar13 = psVar25;
          if (bVar10) {
            iVar7 = 10;
          }
        }
      } while (iVar7 == 0);
      if (iVar7 == 10) {
        bVar26 = true;
      }
    }
joined_r0x0011e95f:
    if (bVar26) {
      local_290 = (storage_type_conflict *)0xffffffffffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (qsizetype)local_290;
}

Assistant:

static inline qsizetype bm_find(QStringView haystack, qsizetype index, QStringView needle,
                          const uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = haystack.utf16();
    const qsizetype l = haystack.size();
    const char16_t *puc = needle.utf16();
    const qsizetype pl = needle.size();

    if (pl == 0)
        return index > l ? -1 : index;

    if (cs == Qt::CaseSensitive) {
        const qsizetype pl_minus_one = pl - 1;
        const char16_t *current = uc + index + pl_minus_one;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[*current & 0xff];
            if (!skip) {
                // possible match
                while (skip < pl) {
                    if (*(current - skip) != puc[pl_minus_one-skip])
                        break;
                    ++skip;
                }
                if (skip > pl_minus_one) // we have a match
                    return (current - uc) - pl_minus_one;

                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[*(current - skip) & 0xff] == pl)
                    skip = pl - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    } else {
        char16_t foldBuffer[FoldBufferCapacity];
        const qsizetype foldBufferLength = qMin(FoldBufferCapacity, pl);
        const char16_t *start = puc;
        for (qsizetype i = 0; i < foldBufferLength; ++i)
            foldBuffer[i] = foldCase(&puc[i], start);
        QStringView restNeedle = needle.sliced(foldBufferLength);
        const qsizetype foldBufferEnd = foldBufferLength - 1;
        const char16_t *current = uc + index + foldBufferEnd;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[foldCase(current, uc) & 0xff];
            if (!skip) {
                // possible match
                while (skip < foldBufferLength) {
                    if (foldCase(current - skip, uc) != foldBuffer[foldBufferEnd - skip])
                        break;
                    ++skip;
                }
                if (skip > foldBufferEnd) { // Matching foldBuffer
                    qsizetype candidatePos = (current - uc) - foldBufferEnd;
                    QStringView restHaystack =
                            haystack.sliced(qMin(haystack.size(), candidatePos + foldBufferLength));
                    if (restNeedle.size() == 0
                        || restHaystack.startsWith(
                                restNeedle, Qt::CaseInsensitive)) // Check the rest of the string
                        return candidatePos;
                }
                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[foldCase(current - skip, uc) & 0xff] == foldBufferLength)
                    skip = foldBufferLength - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    }
    return -1; // not found
}